

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::Workitem,_true,_false>::freeLinkedList
          (LinkedListPool<depspawn::internal::Workitem,_true,_false> *this,Workitem *datain,
          Workitem *last_datain,bool no_dealloc)

{
  byte bVar1;
  bool bVar2;
  __pointer_type pWVar3;
  byte in_CL;
  __pointer_type *in_RDX;
  Workitem *in_RSI;
  atomic<depspawn::internal::Workitem_*> *in_RDI;
  undefined8 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  pWVar3 = std::atomic<depspawn::internal::Workitem_*>::load
                     (in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  in_RDX[3] = pWVar3;
  do {
    next_ptr(in_RSI,in_RDX[3]);
    bVar2 = std::atomic<depspawn::internal::Workitem_*>::compare_exchange_weak
                      ((atomic<depspawn::internal::Workitem_*> *)in_RSI,in_RDX,
                       (__pointer_type)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                       (memory_order)((ulong)in_RDI >> 0x20));
  } while (((bVar2 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void freeLinkedList(T* const datain, T* const last_datain, const bool no_dealloc = false) noexcept(ALLOC_ONCE)
  {
    if (!ALLOC_ONCE && !no_dealloc) {
      last_datain->next = nullptr;
      for (T* p = datain; p != nullptr; p = static_cast<T *>(p->next)) {
        p->~T();
      }
    }

    last_datain->next = head_.load(std::memory_order_relaxed);
    while(!head_.compare_exchange_weak(reinterpret_cast<T*&>(last_datain->next), next_ptr(datain, static_cast<T *>(last_datain->next))));
  }